

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&>,testing::Matcher<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&>,testing::Matcher<std::optional<SDL_Rect>const&>,testing::Matcher<std::optional<SDL_Rect>const&>>,std::tuple<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&,std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&,std::optional<SDL_Rect>const&,std::optional<SDL_Rect>const&>>
               (tuple<testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                *matcher_tuple,
               tuple<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&>
               *value_tuple)

{
  bool bVar1;
  DummyMatchResultListener dummy;
  MatchResultListener local_28;
  
  local_28.stream_ = (ostream *)0x0;
  local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_0031e0e8;
  bVar1 = MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
          ::MatchAndExplain((MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
                             *)&(matcher_tuple->
                                super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                                ).
                                super__Head_base<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_false>
                            ,(value_tuple->
                             super__Tuple_impl<0UL,_const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&>
                             ).
                             super__Head_base<0UL,_const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_false>
                             ._M_head_impl,&local_28);
  if (bVar1) {
    local_28.stream_ = (ostream *)0x0;
    local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_0031e0e8;
    bVar1 = MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>
            ::MatchAndExplain((MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>
                               *)&(matcher_tuple->
                                  super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                                  ).
                                  super__Tuple_impl<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                                  .
                                  super__Head_base<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_false>
                              ,(value_tuple->
                               super__Tuple_impl<0UL,_const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&>
                               ).
                               super__Tuple_impl<1UL,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&>
                               .
                               super__Head_base<1UL,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_false>
                               ._M_head_impl,&local_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }